

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLevel1DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,float coordX,int coordY,UVec4 *result)

{
  bool bVar1;
  int iVar2;
  int c;
  float fVar3;
  float fVar4;
  Vec2 uBounds;
  Vector<unsigned_int,_4> color;
  float local_48;
  float local_44;
  tcu local_40 [16];
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_48,sampler->normalizedCoords,(access->m_size).m_data[0],
             coordX,(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  fVar3 = floorf(local_48);
  fVar4 = floorf(local_44);
  iVar2 = (int)fVar3;
  do {
    c = iVar2;
    if ((int)fVar4 < c) break;
    iVar2 = TexVerifierUtil::wrap(sampler->wrapS,c,(access->m_size).m_data[0]);
    lookup<unsigned_int>(local_40,access,sampler,iVar2,coordY,0);
    bVar1 = isColorValid(prec,(UVec4 *)local_40,result);
    iVar2 = c + 1;
  } while (!bVar1);
  return c <= (int)fVar4;
}

Assistant:

bool isLevel1DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const float					coordX,
								 const int						coordY,
								 const UVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coordX, coordY, result);
}